

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTLDec(u32 *tag,size_t *len,octet *der,size_t count)

{
  size_t in_RCX;
  octet *in_RDX;
  size_t *in_RSI;
  u32 *in_RDI;
  size_t l;
  size_t l_count;
  size_t t_count;
  size_t local_40 [2];
  size_t local_30;
  size_t local_28;
  octet *local_20;
  size_t *local_18;
  size_t local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = derTDec(in_RDI,in_RDX,in_RCX);
  if (local_30 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = derLDec(local_40,local_20 + local_30,local_28 - local_30);
    if ((local_8 == 0xffffffffffffffff) || (local_28 < local_30 + local_8)) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      if (local_18 != (size_t *)0x0) {
        *local_18 = local_40[0];
      }
      local_8 = local_30 + local_8;
    }
  }
  return local_8;
}

Assistant:

size_t derTLDec(u32* tag, size_t* len, const octet der[], size_t count)
{
	size_t t_count;
	size_t l_count;
	size_t l;
	ASSERT(memIsValid(der, count));
	// обработать T
	ASSERT(tag == 0 || memIsDisjoint2(tag, 4, der, count));
	t_count = derTDec(tag, der, count);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// обработать L
	ASSERT(count >= t_count);
	l_count = derLDec(&l, der + t_count, count - t_count);
	if (l_count == SIZE_MAX || t_count + l_count > count)
		return SIZE_MAX;
	if (len)
	{
		ASSERT(memIsDisjoint2(len, O_PER_S, der, count));
		ASSERT(tag == 0 || memIsDisjoint2(len, O_PER_S, tag, 4));
		*len = l;
	}
	// все нормально
	return t_count + l_count;
}